

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 VmLocalExec(jx9_vm *pVm,SySet *pByteCode,jx9_value *pResult)

{
  sxi32 sVar1;
  jx9_value *pStack;
  
  pStack = VmNewOperandStack(pVm,pByteCode->nUsed);
  if (pStack == (jx9_value *)0x0) {
    sVar1 = -1;
  }
  else {
    sVar1 = VmByteCodeExec(pVm,(VmInstr *)pByteCode->pBase,pStack,-1,pResult);
    SyMemBackendFree(&pVm->sAllocator,pStack);
  }
  return sVar1;
}

Assistant:

static sxi32 VmLocalExec(jx9_vm *pVm, SySet *pByteCode,jx9_value *pResult)
{
	jx9_value *pStack;
	sxi32 rc;
	/* Allocate a new operand stack */
	pStack = VmNewOperandStack(&(*pVm), SySetUsed(pByteCode));
	if( pStack == 0 ){
		return SXERR_MEM;
	}
	/* Execute the program */
	rc = VmByteCodeExec(&(*pVm), (VmInstr *)SySetBasePtr(pByteCode), pStack, -1, &(*pResult));
	/* Free the operand stack */
	SyMemBackendFree(&pVm->sAllocator, pStack);
	/* Execution result */
	return rc;
}